

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_sc_w(DisasContext_conflict11 *ctx,arg_sc_w *a)

{
  uint uVar1;
  TCGContext_conflict9 *s;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *a2;
  TCGLabel *l;
  TCGLabel *a1_01;
  uintptr_t o;
  TCGv_i32 pTVar2;
  TCGv_i32 a2_00;
  uintptr_t o_2;
  TCGOpcode TVar3;
  uintptr_t o_4;
  uintptr_t o_6;
  TCGv_i32 newv;
  uintptr_t o_5;
  TCGv_i32 arg2;
  
  uVar1 = ctx->misa;
  if ((uVar1 & 1) == 0) goto LAB_00c32c6c;
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv32(s,TCG_TYPE_I32,false);
  arg2 = (TCGv_i32)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_riscv32(s,TCG_TYPE_I32,false);
  a2 = tcg_temp_new_internal_riscv32(s,TCG_TYPE_I32,false);
  l = gen_new_label_riscv32(s);
  a1_01 = gen_new_label_riscv32(s);
  if ((long)a->rs1 == 0) {
    TVar3 = INDEX_op_movi_i32;
    pTVar2 = (TCGv_i32)0x0;
LAB_00c32a84:
    tcg_gen_op2_riscv32(s,TVar3,(TCGArg)a1,(TCGArg)pTVar2);
  }
  else if (s->cpu_gpr[a->rs1] != arg2) {
    pTVar2 = s->cpu_gpr[a->rs1] + (long)s;
    TVar3 = INDEX_op_mov_i32;
    goto LAB_00c32a84;
  }
  newv = (TCGv_i32)((long)a1_00 - (long)s);
  pTVar2 = (TCGv_i32)((long)a2 - (long)s);
  tcg_gen_brcond_i32_riscv32(s,TCG_COND_NE,s->load_res,arg2,l);
  if ((long)a->rs2 == 0) {
    TVar3 = INDEX_op_movi_i32;
    a2_00 = (TCGv_i32)0x0;
LAB_00c32aeb:
    tcg_gen_op2_riscv32(s,TVar3,(TCGArg)a1_00,(TCGArg)a2_00);
  }
  else if (s->cpu_gpr[a->rs2] != newv) {
    a2_00 = s->cpu_gpr[a->rs2] + (long)s;
    TVar3 = INDEX_op_mov_i32;
    goto LAB_00c32aeb;
  }
  tcg_gen_atomic_cmpxchg_i32_riscv32
            (s,arg2,s->load_res,s->load_val,newv,(ulong)ctx->mem_idx,MO_ALIGN|MO_LESL);
  tcg_gen_setcond_i32_riscv32(s,TCG_COND_NE,pTVar2,arg2,s->load_val);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != pTVar2)) {
    tcg_gen_op2_riscv32(s,INDEX_op_mov_i32,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a2);
  }
  *(short *)&a1_01->field_0x2 =
       (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
  tcg_gen_op1_riscv32(s,INDEX_op_br,(TCGArg)a1_01);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_riscv32(s,INDEX_op_set_label,(TCGArg)l);
  tcg_gen_mb_riscv32(s,a->rl * 0x20 + a->aq * 0x10 + TCG_MO_ALL);
  tcg_gen_op2_riscv32(s,INDEX_op_movi_i32,(TCGArg)a2,1);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != pTVar2)) {
    tcg_gen_op2_riscv32(s,INDEX_op_mov_i32,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a2);
  }
  *(byte *)a1_01 = *(byte *)a1_01 | 1;
  tcg_gen_op1_riscv32(s,INDEX_op_set_label,(TCGArg)a1_01);
  tcg_gen_op2_riscv32(s,INDEX_op_movi_i32,(TCGArg)(s->load_res + (long)s),0xffffffffffffffff);
  tcg_temp_free_internal_riscv32(s,(TCGTemp *)(pTVar2 + (long)s));
  tcg_temp_free_internal_riscv32(s,(TCGTemp *)(arg2 + (long)s));
  tcg_temp_free_internal_riscv32(s,(TCGTemp *)(newv + (long)s));
LAB_00c32c6c:
  return (_Bool)((byte)uVar1 & 1);
}

Assistant:

static inline bool has_ext(DisasContext *ctx, uint32_t ext)
{
    return ctx->misa & ext;
}